

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::DiagnoseCycle(cmOrderDirectories *this)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  size_type sVar4;
  reference pvVar5;
  pointer ppVar6;
  reference ppcVar7;
  cmake *this_00;
  cmListFileBacktrace local_1f0;
  string local_1d0;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_1b0;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_1a8;
  const_iterator j;
  ConflictList *clist;
  uint i;
  undefined1 local_188 [8];
  ostringstream e;
  cmOrderDirectories *this_local;
  
  if ((this->CycleDiagnosed & 1U) == 0) {
    this->CycleDiagnosed = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    poVar2 = std::operator<<((ostream *)local_188,"Cannot generate a safe ");
    poVar2 = std::operator<<(poVar2,(string *)&this->Purpose);
    poVar2 = std::operator<<(poVar2," for target ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2," because there is a cycle in the constraint graph:\n");
    for (clist._0_4_ = 0;
        sVar4 = std::
                vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                ::size(&this->ConflictGraph), (uint)clist < sVar4; clist._0_4_ = (uint)clist + 1) {
      j._M_current = (pair<int,_int> *)
                     std::
                     vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                     ::operator[](&this->ConflictGraph,(ulong)(uint)clist);
      poVar2 = std::operator<<((ostream *)local_188,"  dir ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)clist);
      poVar2 = std::operator<<(poVar2," is [");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->OriginalDirectories,(ulong)(uint)clist);
      poVar2 = std::operator<<(poVar2,(string *)pvVar5);
      std::operator<<(poVar2,"]\n");
      local_1a8._M_current =
           (pair<int,_int> *)
           std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     (j._M_current);
      while( true ) {
        local_1b0._M_current =
             (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                       (j._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_1a8,&local_1b0);
        if (!bVar1) break;
        poVar2 = std::operator<<((ostream *)local_188,"    dir ");
        ppVar6 = __gnu_cxx::
                 __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator->(&local_1a8);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar6->first);
        std::operator<<(poVar2," must precede it due to ");
        ppVar6 = __gnu_cxx::
                 __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator->(&local_1a8);
        ppcVar7 = std::
                  vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                  ::operator[](&this->ConstraintEntries,(long)ppVar6->second);
        (*(*ppcVar7)->_vptr_cmOrderDirectoriesConstraint[2])(*ppcVar7,local_188);
        std::operator<<((ostream *)local_188,"\n");
        __gnu_cxx::
        __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&local_1a8);
      }
    }
    std::operator<<((ostream *)local_188,"Some of these libraries may not be found correctly.");
    this_00 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    std::__cxx11::ostringstream::str();
    cmGeneratorTarget::GetBacktrace(&local_1f0,this->Target);
    cmake::IssueMessage(this_00,WARNING,&local_1d0,&local_1f0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  }
  return;
}

Assistant:

void cmOrderDirectories::DiagnoseCycle()
{
  // Report the cycle at most once.
  if (this->CycleDiagnosed) {
    return;
  }
  this->CycleDiagnosed = true;

  // Construct the message.
  std::ostringstream e;
  e << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because there is a cycle in the constraint graph:\n";

  // Display the conflict graph.
  for (unsigned int i = 0; i < this->ConflictGraph.size(); ++i) {
    ConflictList const& clist = this->ConflictGraph[i];
    e << "  dir " << i << " is [" << this->OriginalDirectories[i] << "]\n";
    for (ConflictList::const_iterator j = clist.begin(); j != clist.end();
         ++j) {
      e << "    dir " << j->first << " must precede it due to ";
      this->ConstraintEntries[j->second]->Report(e);
      e << "\n";
    }
  }
  e << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    cmake::WARNING, e.str(), this->Target->GetBacktrace());
}